

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O3

err_t RenderBlockData(matroska_block *Element,stream *Output,bool_t bForceWithoutMandatory,
                     bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  ushort uVar1;
  ebml_master *peVar2;
  void *pvVar3;
  char cVar4;
  byte bVar5;
  ebml_context *peVar6;
  bool_t bVar7;
  long lVar8;
  ebml_master *peVar9;
  char *pcVar10;
  ulong uVar11;
  ebml_context *peVar12;
  size_t sVar13;
  filepos_t fVar14;
  filepos_t fVar15;
  err_t eVar16;
  ushort *puVar17;
  size_t sVar18;
  int iVar19;
  MatroskaContentEncodingScope CompScope;
  int64_t iVar20;
  int *piVar21;
  uint uVar22;
  long lVar23;
  ebml_integer *peVar24;
  ulong uVar25;
  int64_t iVar26;
  ulong uVar27;
  uint8_t *Cursor;
  size_t Written;
  uint8_t BlockHead [5];
  uint8_t *OutBuf;
  long local_a0;
  ebml_integer *local_98;
  char *local_90;
  int64_t local_88;
  undefined8 local_80;
  long *local_78;
  int64_t local_70;
  byte local_65;
  byte local_64;
  ushort uStack_63;
  size_t local_60;
  stream *local_58;
  uint8_t *local_50;
  array local_48;
  
  cVar4 = Element->Lacing;
  if (cVar4 == '\x04') {
    __assert_fail("Element->Lacing != LACING_AUTO",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x6a7,
                  "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  uVar1 = Element->TrackNumber;
  if (uVar1 < 0x80) {
    puVar17 = (ushort *)&local_64;
    local_65 = (byte)uVar1 | 0x80;
    lVar23 = 4;
  }
  else {
    if (0x3fff < uVar1) {
      return -3;
    }
    puVar17 = &uStack_63;
    local_65 = (byte)(uVar1 >> 8) | 0x40;
    lVar23 = 5;
    local_64 = (byte)uVar1;
  }
  *puVar17 = Element->LocalTimestamp << 8 | (ushort)Element->LocalTimestamp >> 8;
  *(char *)(puVar17 + 1) = cVar4 * '\x02' | (Element->Invisible != 0) << 3;
  peVar6 = MATROSKA_getContextSimpleBlock();
  bVar7 = EBML_ElementIsType((ebml_element *)Element,peVar6);
  if (bVar7 != 0) {
    if (Element->IsKeyframe != 0) {
      *(byte *)(puVar17 + 1) = (byte)puVar17[1] | 0x80;
    }
    if (Element->IsDiscardable != 0) {
      *(byte *)(puVar17 + 1) = (byte)puVar17[1] | 1;
    }
  }
  if (Output == (stream *)0x0) {
    __assert_fail("(const void*)(Output)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x6c7,
                  "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  lVar8 = (**(code **)((long)(Output->Base).VMT + 0x70))(Output,&local_65,lVar23);
  if (lVar8 != 0) {
    return lVar8;
  }
  if (local_a0 != lVar23) {
    return -0x16;
  }
  if (Rendered != (filepos_t *)0x0) {
    *Rendered = lVar23;
  }
  peVar9 = Element->WriteTrack;
  local_78 = Rendered;
  if (peVar9 == (ebml_master *)0x0) {
    __assert_fail("Element->WriteTrack!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x6d2,
                  "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  peVar6 = MATROSKA_getContextContentEncodings();
  peVar24 = (ebml_integer *)0x0;
  peVar9 = (ebml_master *)EBML_MasterFindFirstElt(peVar9,peVar6,0,0,0);
  local_88 = 1;
  iVar26 = 0xffffffff;
  if (peVar9 == (ebml_master *)0x0) {
    local_80 = 0;
  }
  else {
    peVar6 = MATROSKA_getContextContentEncoding();
    peVar24 = (ebml_integer *)0x0;
    peVar9 = (ebml_master *)EBML_MasterFindFirstElt(peVar9,peVar6,0,0,0);
    if ((peVar9->Base).Base.Children == (nodetree *)0x0) {
      local_80 = 0;
      iVar26 = 0xffffffff;
    }
    else {
      peVar2 = (ebml_master *)(peVar9->Base).Base.Next;
      if (peVar9 == peVar2) {
        __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x6d9,
                      "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                     );
      }
      if (peVar2 != (ebml_master *)0x0) {
        return -3;
      }
      peVar6 = MATROSKA_getContextContentEncodingScope();
      peVar24 = (ebml_integer *)EBML_MasterFindFirstElt(peVar9,peVar6,0,0,0);
      if (peVar24 == (ebml_integer *)0x0) {
        local_88 = 1;
      }
      else {
        local_88 = EBML_IntegerValue(peVar24);
      }
      peVar6 = MATROSKA_getContextContentCompression();
      peVar9 = (ebml_master *)EBML_MasterFindFirstElt(peVar9,peVar6,0,0,0);
      if (peVar9 == (ebml_master *)0x0) {
        return -3;
      }
      peVar6 = MATROSKA_getContextContentCompAlgo();
      peVar24 = (ebml_integer *)EBML_MasterFindFirstElt(peVar9,peVar6,1,1,ForProfile);
      if (peVar24 == (ebml_integer *)0x0) {
        return -5;
      }
      iVar26 = EBML_IntegerValue(peVar24);
      if ((int)iVar26 == 0) {
        local_80 = CONCAT71((int7)((ulong)iVar26 >> 8),1);
      }
      else {
        if ((int)iVar26 != 3) {
          return -5;
        }
        peVar6 = MATROSKA_getContextContentCompSettings();
        local_80 = 0;
        peVar24 = (ebml_integer *)EBML_MasterFindFirstElt(peVar9,peVar6,0,0,0);
        iVar26 = 3;
      }
    }
  }
  cVar4 = Element->Lacing;
  if (cVar4 == '\x04') {
    cVar4 = GetBestLacingType(Element,ForProfile);
    Element->Lacing = cVar4;
  }
  iVar20 = local_88;
  CompScope = (MatroskaContentEncodingScope)local_88;
  local_98 = peVar24;
  if (cVar4 == '\0') goto LAB_00112545;
  uVar11 = (Element->SizeList)._Used;
  uVar25 = uVar11 & 0xfffffffffffffffc;
  local_70 = iVar26;
  pcVar10 = (char *)malloc(uVar25 + 1);
  if (pcVar10 == (char *)0x0) {
    return -2;
  }
  *pcVar10 = (char)(uVar11 >> 2) + -1;
  local_90 = pcVar10;
  if (cVar4 == '\x03') {
    local_58 = Output;
    fVar14 = GetBlockFrameSize(Element,0,&local_98->Base,(MatroskaTrackEncodingCompAlgo)local_70,
                               CompScope);
    sVar18 = 1;
    bVar5 = EBML_CodedSizeLength((long)(int)fVar14,'\0',1);
    bVar5 = EBML_CodedValueLength((long)(int)fVar14,(ulong)bVar5,(uint8_t *)(pcVar10 + 1),1);
    pcVar10 = local_90;
    uVar27 = (ulong)bVar5 + 1;
    uVar11 = (Element->SizeList)._Used;
    if ((uVar11 >> 2) - 3 < 0xfffffffffffffffe) {
      do {
        fVar15 = GetBlockFrameSize(Element,sVar18,&local_98->Base,
                                   (MatroskaTrackEncodingCompAlgo)local_70,
                                   (MatroskaContentEncodingScope)iVar20);
        lVar23 = (long)((int)fVar15 - (int)fVar14);
        bVar5 = EBML_CodedSizeLengthSigned(lVar23,'\0');
        bVar5 = EBML_CodedValueLengthSigned(lVar23,(ulong)bVar5,(uint8_t *)(pcVar10 + uVar27));
        uVar27 = uVar27 + bVar5;
        sVar18 = sVar18 + 1;
        uVar11 = (Element->SizeList)._Used;
        CompScope = (MatroskaContentEncodingScope)local_88;
        iVar20 = local_88;
        fVar14 = fVar15;
      } while (sVar18 < (uVar11 >> 2) - 1);
    }
LAB_001124ed:
    Output = local_58;
    if ((uVar11 & 0xfffffffffffffffc) + 1 < uVar27) {
      __assert_fail("LaceSize <= (1 + ARRAYCOUNT(Element->SizeList,int32_t)*4)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x72a,
                    "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
  }
  else {
    uVar27 = 1;
    if ((cVar4 == '\x01') && (uVar25 != 4)) {
      sVar18 = 0;
      local_58 = Output;
      do {
        uVar11 = GetBlockFrameSize(Element,sVar18,&local_98->Base,
                                   (MatroskaTrackEncodingCompAlgo)local_70,
                                   (MatroskaContentEncodingScope)iVar20);
        pcVar10 = local_90;
        uVar22 = (uint)uVar11;
        if (0xfe < (int)uVar22) {
          iVar19 = uVar22 - 0x1fd;
          if (uVar22 < 0x1fd) {
            iVar19 = 0;
          }
          uVar11 = (ulong)(iVar19 + 0xfeU) / 0xff;
          memset(local_90 + uVar27,0xff,uVar11 + 1);
          uVar27 = uVar27 + uVar11 + 1;
          uVar11 = (ulong)((uVar22 + (iVar19 + 0xfeU) / 0xff) - 0xff);
          iVar20 = local_88;
        }
        CompScope = (MatroskaContentEncodingScope)iVar20;
        pcVar10[uVar27] = (char)uVar11;
        uVar27 = uVar27 + 1;
        sVar18 = sVar18 + 1;
        uVar11 = (Element->SizeList)._Used;
      } while (sVar18 < (uVar11 >> 2) - 1);
      goto LAB_001124ed;
    }
  }
  lVar23 = (**(code **)((long)(Output->Base).VMT + 0x70))(Output,pcVar10,uVar27,&local_a0);
  if (lVar23 != 0) {
    return lVar23;
  }
  if (local_78 != (long *)0x0) {
    *local_78 = *local_78 + local_a0;
  }
  free(local_90);
LAB_00112545:
  peVar24 = local_98;
  (**(code **)((long)(Element->Base).Base.Base.Base.VMT + 0x20))
            (Element,0x180,&Element->WriteTrack,8);
  Cursor = (uint8_t *)(Element->Data)._Begin;
  if ((peVar24 == (ebml_integer *)0x0) || ((CompScope & MATROSKA_CONTENTENCODINGSCOPE_BLOCK) == 0))
  {
    eVar16 = (**(code **)((long)(Output->Base).VMT + 0x70))
                       (Output,Cursor,(Element->Data)._Used,&local_a0);
    if (local_78 != (long *)0x0) {
      *local_78 = *local_78 + local_a0;
    }
  }
  else {
    peVar6 = (peVar24->Base).Context;
    peVar12 = MATROSKA_getContextContentCompAlgo();
    peVar24 = local_98;
    if (peVar6 == peVar12) {
      if ((char)local_80 != '\0') {
        local_48._Begin = (char *)0x0;
        local_48._Used = 0;
        if (3 < (Element->SizeList)._Used) {
          piVar21 = (int *)(Element->SizeList)._Begin;
          do {
            bVar7 = ArrayResize(&local_48,(long)*piVar21 + 100,0);
            if (bVar7 == 0) {
LAB_0011279c:
              ArrayClear(&local_48);
              return -2;
            }
            local_50 = (uint8_t *)local_48._Begin;
            local_60 = local_48._Used;
            eVar16 = CompressFrameZLib(Cursor,(long)*piVar21,&local_50,&local_60);
            if (eVar16 != 0) goto LAB_0011279c;
            lVar23 = (**(code **)((long)(Output->Base).VMT + 0x70))
                               (Output,local_50,local_60,&local_a0);
            ArrayClear(&local_48);
            if (local_78 != (long *)0x0) {
              *local_78 = *local_78 + local_a0;
            }
            if (lVar23 != 0) {
              return lVar23;
            }
            Cursor = Cursor + *piVar21;
            piVar21 = piVar21 + 1;
          } while (piVar21 !=
                   (int *)((Element->SizeList)._Begin +
                          ((Element->SizeList)._Used & 0xfffffffffffffffc)));
        }
      }
    }
    else if (3 < (Element->SizeList)._Used) {
      piVar21 = (int *)(Element->SizeList)._Begin;
      while( true ) {
        pvVar3 = (void *)peVar24->Value;
        sVar13 = EBML_ElementDataSize(&peVar24->Base,1);
        iVar19 = bcmp(Cursor,pvVar3,sVar13);
        if (iVar19 != 0) {
          __assert_fail("memcmp(Cursor,ARRAYBEGIN(((ebml_binary*)Header)->Data,uint8_t),(size_t)EBML_ElementDataSize(Header, 1))==0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x761,
                        "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        pvVar3 = (void *)peVar24->Value;
        sVar13 = EBML_ElementDataSize(&peVar24->Base,1);
        iVar19 = bcmp(Cursor,pvVar3,sVar13);
        if (iVar19 != 0) break;
        fVar14 = EBML_ElementDataSize(&peVar24->Base,1);
        iVar19 = *piVar21;
        fVar15 = EBML_ElementDataSize(&peVar24->Base,1);
        local_60 = iVar19 - fVar15;
        eVar16 = (**(code **)((long)(Output->Base).VMT + 0x70))
                           (Output,Cursor + fVar14,local_60,&local_a0);
        if (local_78 != (long *)0x0) {
          *local_78 = *local_78 + local_a0;
        }
        Cursor = Cursor + fVar14 + local_a0;
        piVar21 = piVar21 + 1;
        if (piVar21 ==
            (int *)((Element->SizeList)._Begin + ((Element->SizeList)._Used & 0xfffffffffffffffc)))
        {
          return eVar16;
        }
      }
      return -3;
    }
    eVar16 = 0;
  }
  return eVar16;
}

Assistant:

static err_t RenderBlockData(matroska_block *Element, struct stream *Output, bool_t UNUSED_PARAM(bForceWithoutMandatory), bool_t UNUSED_PARAM(bWithDefault), int ForProfile, filepos_t *Rendered)
{
    err_t Err = ERR_NONE;
    uint8_t BlockHead[5], *Cursor;
    size_t ToWrite, Written, BlockHeadSize = 4;
    ebml_element *Elt, *Elt2, *Header = NULL;
    MatroskaTrackEncodingCompAlgo CompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
    MatroskaContentEncodingScope CompressionScope = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
    assert(Element->Lacing != LACING_AUTO);

    if (Element->TrackNumber < 0x80)
    {
        BlockHead[0] = 0x80 | (Element->TrackNumber & 0xFF);
        Cursor = &BlockHead[1];
    }
    else if (Element->TrackNumber < 0x4000)
    {
        BlockHead[0] = 0x40 | (Element->TrackNumber >> 8);
        BlockHead[1] = Element->TrackNumber & 0xFF;
        Cursor = &BlockHead[2];
        BlockHeadSize = 5;
    }
    else
        return ERR_INVALID_DATA;

    STORE16BE(Cursor,Element->LocalTimestamp);
    Cursor += 2;

    *Cursor = 0;
    if (Element->Invisible)
        *Cursor |= 0x08;
    *Cursor |= Element->Lacing << 1;
    if (EBML_ElementIsType((ebml_element*)Element, MATROSKA_getContextSimpleBlock()))
    {
        if (Element->IsKeyframe)
            *Cursor |= 0x80;
        if (Element->IsDiscardable)
            *Cursor |= 0x01;
    }

    Err = Stream_Write(Output,BlockHead,BlockHeadSize,&Written);
    if (Err != ERR_NONE)
        goto failed;
    if (Written != BlockHeadSize)
    {
        Err = ERR_WRITE;
        goto failed;
    }
    if (Rendered)
        *Rendered = Written;

    assert(Element->WriteTrack!=NULL);
    Elt = EBML_MasterFindChild(Element->WriteTrack, MATROSKA_getContextContentEncodings());
    if (Elt)
    {
        Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncoding());
        if (EBML_MasterChildren(Elt))
        {
            if (EBML_MasterNext(Elt))
                return ERR_INVALID_DATA; // TODO support cascaded compression/encryption

            Elt2 = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncodingScope());
            if (Elt2)
                CompressionScope = EBML_IntegerValue((ebml_integer*)Elt2);

            Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompression());
            if (!Elt)
                return ERR_INVALID_DATA; // TODO: support encryption

            Header = EBML_MasterGetChild((ebml_master*)Elt, MATROSKA_getContextContentCompAlgo(),ForProfile);
            if (Header)
                CompressionAlgo = EBML_IntegerValue((ebml_integer*)Header);
            bool_t CanCompress = 0;
            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                CanCompress = 1;
#if defined(CONFIG_ZLIB)
            else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
                CanCompress = 1;
#endif
            if (!CanCompress)
            {
                Err = ERR_NOT_SUPPORTED;
                goto failed;
            }

            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                Header = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompSettings());
        }
    }

#if !defined(CONFIG_ZLIB)
    if (Header && Header->Context==MATROSKA_getContextContentCompAlgo())
    {
        Err = ERR_NOT_SUPPORTED;
        goto failed;
    }
#endif

    if (Element->Lacing == LACING_AUTO)
        Element->Lacing = GetBestLacingType(Element, ForProfile);
    if (Element->Lacing != LACING_NONE)
    {
        uint8_t *LaceHead = malloc(1 + ARRAYCOUNT(Element->SizeList,int32_t)*4);
        size_t i,LaceSize = 1;
        int32_t DataSize, PrevSize;
        if (!LaceHead)
        {
            Err = ERR_OUT_OF_MEMORY;
            goto failed;
        }
        LaceHead[0] = (ARRAYCOUNT(Element->SizeList,int32_t)-1) & 0xFF; // number of elements in the lace
        if (Element->Lacing == LACING_EBML)
        {
            DataSize = (int32_t)GetBlockFrameSize(Element, 0, Header, CompressionAlgo, CompressionScope);
            LaceSize += EBML_CodedValueLength(DataSize,EBML_CodedSizeLength(DataSize,0,1),LaceHead+LaceSize, 1);
            for (i=1;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
            {
                PrevSize = DataSize;
                DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope);
                LaceSize += EBML_CodedValueLengthSigned(DataSize-PrevSize,EBML_CodedSizeLengthSigned(DataSize-PrevSize,0),LaceHead+LaceSize);
            }
        }
        else if (Element->Lacing == LACING_XIPH)
        {
            for (i=0;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
            {
                DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope);
                while (DataSize >= 0xFF)
                {
                    LaceHead[LaceSize++] = 0xFF;
                    DataSize -= 0xFF;
                }
                LaceHead[LaceSize++] = (uint8_t)DataSize;
            }
        }
        else if (Element->Lacing == LACING_FIXED)
        {
            // nothing to write
        }
        assert(LaceSize <= (1 + ARRAYCOUNT(Element->SizeList,int32_t)*4));
        Err = Stream_Write(Output,LaceHead,LaceSize,&Written);
        if (Err != ERR_NONE)
            goto failed;
        if (Rendered)
            *Rendered += Written;
        free(LaceHead);
    }
    Node_SET(Element,MATROSKA_BLOCK_READ_TRACK,&Element->WriteTrack); // now use the write track for consecutive read of the same element

    Cursor = ARRAYBEGIN(Element->Data,uint8_t);
    if (Header && (CompressionScope & MATROSKA_CONTENTENCODINGSCOPE_BLOCK))
    {
        int32_t* i;
        if (Header && Header->Context==MATROSKA_getContextContentCompAlgo())
        {
#if defined(CONFIG_ZLIB)
            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
            {
                uint8_t *OutBuf;
                array TmpBuf;
                ArrayInit(&TmpBuf);
                for (i=ARRAYBEGIN(Element->SizeList,int32_t);i!=ARRAYEND(Element->SizeList,int32_t);++i)
                {
                    if (!ArrayResize(&TmpBuf,*i + 100,0))
                    {
                        ArrayClear(&TmpBuf);
                        Err = ERR_OUT_OF_MEMORY;
                        break;
                    }
                    OutBuf = ARRAYBEGIN(TmpBuf,uint8_t);
                    ToWrite = ARRAYCOUNT(TmpBuf,uint8_t);
                    if (CompressFrameZLib(Cursor, *i, &OutBuf, &ToWrite) != ERR_NONE)
                    {
                        ArrayClear(&TmpBuf);
                        Err = ERR_OUT_OF_MEMORY;
                        break;
                    }

                    Err = Stream_Write(Output,OutBuf,ToWrite,&Written);
                    ArrayClear(&TmpBuf);
                    if (Rendered)
                        *Rendered += Written;
                    Cursor += *i;
                    if (Err!=ERR_NONE)
                        break;
                }
            }
#endif
        }
        else
        {
            // header compression
            for (i=ARRAYBEGIN(Element->SizeList,int32_t);i!=ARRAYEND(Element->SizeList,int32_t);++i)
            {
                assert(memcmp(Cursor,ARRAYBEGIN(((ebml_binary*)Header)->Data,uint8_t),(size_t)EBML_ElementDataSize(Header, 1))==0);
                if (memcmp(Cursor,ARRAYBEGIN(((ebml_binary*)Header)->Data,uint8_t),(size_t)EBML_ElementDataSize(Header, 1))!=0)
                {
                    Err = ERR_INVALID_DATA;
                    goto failed;
                }
                Cursor += EBML_ElementDataSize(Header, 1);
                ToWrite = *i - (size_t)EBML_ElementDataSize(Header, 1);
                Err = Stream_Write(Output,Cursor,ToWrite,&Written);
                if (Rendered)
                    *Rendered += Written;
                Cursor += Written;
            }
        }
    }
    else
    {
        ToWrite = ARRAYCOUNT(Element->Data,uint8_t);
        Err = Stream_Write(Output,Cursor,ToWrite,&Written);
        if (Rendered)
            *Rendered += Written;
    }

failed:
    return Err;
}